

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O0

Abc_Ntk_t * Io_ReadDsd(char *pForm)

{
  int iVar1;
  char *pcVar2;
  Vec_Ptr_t *vNames_00;
  Abc_Obj_t *pAVar3;
  size_t sVar4;
  Abc_Obj_t *pObj_00;
  int local_50;
  int local_4c;
  int nInputs;
  int i;
  char *pFormCopy;
  char *pCur;
  Vec_Ptr_t *vNames;
  Abc_Obj_t *pTop;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  char *pForm_local;
  
  local_50 = 0;
  for (pFormCopy = pForm; *pFormCopy != '\0'; pFormCopy = pFormCopy + 1) {
    if (('`' < *pFormCopy) && (*pFormCopy < '{')) {
      local_50 = Abc_MaxInt(local_50,*pFormCopy + -0x61);
    }
  }
  pForm_local = (char *)Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Extra_UtilStrsav("dsd");
  ((Abc_Ntk_t *)pForm_local)->pName = pcVar2;
  vNames_00 = Abc_NodeGetFakeNames(local_50 + 1);
  for (local_4c = 0; local_4c < local_50 + 1; local_4c = local_4c + 1) {
    pAVar3 = Abc_NtkCreatePi((Abc_Ntk_t *)pForm_local);
    pcVar2 = (char *)Vec_PtrEntry(vNames_00,local_4c);
    Abc_ObjAssignName(pAVar3,pcVar2,(char *)0x0);
  }
  Abc_NodeFreeNames(vNames_00);
  sVar4 = strlen(pForm);
  pcVar2 = (char *)malloc(sVar4 * 3 + 10);
  pFormCopy = pcVar2 + 1;
  *pcVar2 = '(';
  for (pNtk = (Abc_Ntk_t *)pForm; (char)pNtk->ntkType != ABC_NTK_NONE;
      pNtk = (Abc_Ntk_t *)((long)&pNtk->ntkType + 1)) {
    if ((char)pNtk->ntkType == 0x28) {
      *pFormCopy = '(';
      pFormCopy[1] = '(';
      pFormCopy = pFormCopy + 2;
    }
    else if ((char)pNtk->ntkType == 0x29) {
      *pFormCopy = ')';
      pFormCopy[1] = ')';
      pFormCopy = pFormCopy + 2;
    }
    else if ((char)pNtk->ntkType == 0x2c) {
      *pFormCopy = ')';
      pFormCopy[1] = ',';
      pFormCopy[2] = '(';
      pFormCopy = pFormCopy + 3;
    }
    else {
      *pFormCopy = (char)pNtk->ntkType;
      pFormCopy = pFormCopy + 1;
    }
  }
  *pFormCopy = ')';
  pFormCopy[1] = '\0';
  pAVar3 = Io_ReadDsd_rec((Abc_Ntk_t *)pForm_local,pcVar2,(char *)0x0);
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  if (pAVar3 == (Abc_Obj_t *)0x0) {
    pForm_local = (char *)0x0;
  }
  else {
    pObj_00 = Abc_NtkCreatePo((Abc_Ntk_t *)pForm_local);
    Abc_ObjAssignName(pObj_00,"F",(char *)0x0);
    Abc_ObjAddFanin(pObj_00,pAVar3);
    iVar1 = Abc_NtkCheck((Abc_Ntk_t *)pForm_local);
    if (iVar1 == 0) {
      fprintf(_stdout,"Io_ReadDsd(): Network check has failed.\n");
      Abc_NtkDelete((Abc_Ntk_t *)pForm_local);
      pForm_local = (char *)0x0;
    }
  }
  return (Abc_Ntk_t *)pForm_local;
}

Assistant:

Abc_Ntk_t * Io_ReadDsd( char * pForm )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pTop;
    Vec_Ptr_t * vNames;
    char * pCur, * pFormCopy;
    int i, nInputs;

    // count the number of elementary variables
    nInputs = 0;
    for ( pCur = pForm; *pCur; pCur++ )
        if ( *pCur >= 'a' && *pCur <= 'z' )
            nInputs = Abc_MaxInt( nInputs, *pCur - 'a' );
    nInputs++;

    // create the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtk->pName = Extra_UtilStrsav( "dsd" );

    // create PIs
    vNames = Abc_NodeGetFakeNames( nInputs );
    for ( i = 0; i < nInputs; i++ )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtk), (char *)Vec_PtrEntry(vNames, i), NULL );
    Abc_NodeFreeNames( vNames );

    // transform the formula by inserting parentheses
    // this transforms strings like PRIME(a,b,cd) into (PRIME((a),(b),(cd)))
    pCur = pFormCopy = ABC_ALLOC( char, 3 * strlen(pForm) + 10 );
    *pCur++ = '(';
    for ( ; *pForm; pForm++ )
        if ( *pForm == '(' )
        {
            *pCur++ = '(';
            *pCur++ = '(';
        }
        else if ( *pForm == ')' )
        {
            *pCur++ = ')';
            *pCur++ = ')';
        }
        else if ( *pForm == ',' )
        {
            *pCur++ = ')';
            *pCur++ = ',';
            *pCur++ = '(';
        }
        else
            *pCur++ = *pForm;
    *pCur++ = ')';
    *pCur = 0;

    // parse the formula
    pObj = Io_ReadDsd_rec( pNtk, pFormCopy, NULL );
    ABC_FREE( pFormCopy );
    if ( pObj == NULL )
        return NULL;

    // create output
    pTop = Abc_NtkCreatePo(pNtk);
    Abc_ObjAssignName( pTop, "F", NULL );
    Abc_ObjAddFanin( pTop, pObj );

    // create the only PO
    if ( !Abc_NtkCheck( pNtk ) )
    {
        fprintf( stdout, "Io_ReadDsd(): Network check has failed.\n" );
        Abc_NtkDelete( pNtk );
        return NULL;
    }
    return pNtk;
}